

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTTClient.cpp
# Opt level: O0

bool __thiscall Network::Client::Buffers::avanceQoS2(Buffers *this,uint32 ID)

{
  byte bVar1;
  uint32 *puVar2;
  bool bVar3;
  uint8 p;
  uint32 ID_local;
  Buffers *this_local;
  
  bVar1 = findID(this,ID);
  bVar3 = bVar1 != this->maxID;
  if (bVar3) {
    puVar2 = packetsID(this);
    puVar2[bVar1] = puVar2[bVar1] | 0x40000000;
  }
  return bVar3;
}

Assistant:

inline bool avanceQoS2(uint32 ID)   { uint8 p = findID(ID); if (p == maxID) return false; packetsID()[p] |= 0x40000000; return true; }